

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::SelectBinder::BindColumnRef
          (BindResult *__return_storage_ptr__,SelectBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  BoundSelectNode *pBVar1;
  bool bVar2;
  ColumnRefExpression *this_00;
  reference pvVar3;
  iterator iVar4;
  BinderException *pBVar5;
  SelectBindState *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_02;
  undefined1 local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  BindResult local_b8;
  
  ExpressionBinder::BindExpression
            (__return_storage_ptr__,(ExpressionBinder *)this,expr_ptr,depth,false);
  if ((__return_storage_ptr__->error).initialized == true) {
    this_00 = BaseExpression::Cast<duckdb::ColumnRefExpression>
                        (&((expr_ptr->
                           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           )._M_t.
                           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
                          super_BaseExpression);
    bVar2 = ColumnRefExpression::IsQualified(this_00);
    if (!bVar2) {
      pBVar1 = (this->super_BaseSelectBinder).node;
      this_02 = &this_00->column_names;
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(this_02,0);
      this_01 = &pBVar1->bind_state;
      iVar4 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this_01,pvVar3);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur != (__node_type *)0x0) {
        if (((this->super_BaseSelectBinder).node)->bound_column_count <=
            *(ulong *)((long)iVar4.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                             ._M_cur + 0x28)) {
          pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_b8,
                     "Column \"%s\" referenced that exists in the SELECT clause - but this column cannot be referenced before it is defined"
                     ,(allocator *)local_100);
          pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::get<true>(this_02,0);
          ::std::__cxx11::string::string((string *)&local_d8,(string *)pvVar3);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar5,(string *)&local_b8,&local_d8);
          __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar2 = SelectBindState::AliasHasSubquery
                          (this_01,*(ulong *)((long)iVar4.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                                  ._M_cur + 0x28));
        if (bVar2) {
          pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_b8,
                     "Alias \"%s\" referenced in a SELECT clause - but the expression has a subquery. This is not yet supported."
                     ,(allocator *)local_100);
          pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::get<true>(this_02,0);
          ::std::__cxx11::string::string((string *)(local_100 + 8),(string *)pvVar3);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar5,(string *)&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_100 + 8));
          __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        SelectBindState::BindAlias
                  ((SelectBindState *)local_100,
                   (idx_t)&((this->super_BaseSelectBinder).node)->bind_state);
        (*(this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder[5])
                  (&local_b8,this,local_100,depth,0);
        BindResult::operator=(__return_storage_ptr__,&local_b8);
        BindResult::~BindResult(&local_b8);
        if (local_100 != (undefined1  [8])0x0) {
          (*(code *)(*(__node_base_ptr *)local_100)[1]._M_nxt)();
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult SelectBinder::BindColumnRef(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {
	// first try to bind the column reference regularly
	auto result = BaseSelectBinder::BindColumnRef(expr_ptr, depth, root_expression);
	if (!result.HasError()) {
		return result;
	}
	// binding failed
	// check in the alias map
	auto &colref = (expr_ptr.get())->Cast<ColumnRefExpression>();
	if (!colref.IsQualified()) {
		auto &bind_state = node.bind_state;
		auto alias_entry = node.bind_state.alias_map.find(colref.column_names[0]);
		if (alias_entry != node.bind_state.alias_map.end()) {
			// found entry!
			auto index = alias_entry->second;
			if (index >= node.bound_column_count) {
				throw BinderException("Column \"%s\" referenced that exists in the SELECT clause - but this column "
				                      "cannot be referenced before it is defined",
				                      colref.column_names[0]);
			}
			if (bind_state.AliasHasSubquery(index)) {
				throw BinderException("Alias \"%s\" referenced in a SELECT clause - but the expression has a subquery."
				                      " This is not yet supported.",
				                      colref.column_names[0]);
			}
			auto copied_expression = node.bind_state.BindAlias(index);
			result = BindExpression(copied_expression, depth, false);
			return result;
		}
	}
	// entry was not found in the alias map: return the original error
	return result;
}